

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::ScannersMixin::FreeBody(ScannersMixin *this,ArenaAllocator *rtAllocator)

{
  Type *pTVar1;
  long lVar2;
  
  if (0 < this->numLiterals) {
    pTVar1 = this->infos;
    lVar2 = 0;
    do {
      TextbookBoyerMoore<char16_t>::FreeBody
                (&((pTVar1[lVar2].ptr)->super_ScannerMixin).scanner,rtAllocator,
                 ((pTVar1[lVar2].ptr)->super_ScannerMixin).super_LiteralMixin.length);
      pTVar1 = this->infos;
      pTVar1[lVar2].ptr = (ScannerInfo *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->numLiterals);
  }
  this->numLiterals = 0;
  return;
}

Assistant:

void ScannersMixin::FreeBody(ArenaAllocator* rtAllocator)
    {
        for (int i = 0; i < numLiterals; i++)
        {
            infos[i]->FreeBody(rtAllocator);
#if DBG
            infos[i] = nullptr;
#endif
        }
#if DBG
        numLiterals = 0;
#endif
    }